

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_file.c
# Opt level: O2

ssize_t FILE_read(archive *a,void *client_data,void **buff)

{
  void *__ptr;
  int iVar1;
  size_t sVar2;
  int *piVar3;
  
  __ptr = *(void **)((long)client_data + 0x10);
  *buff = __ptr;
  sVar2 = fread(__ptr,1,*(size_t *)((long)client_data + 8),*client_data);
  if (sVar2 < *(ulong *)((long)client_data + 8)) {
    iVar1 = ferror(*client_data);
    if (iVar1 != 0) {
      piVar3 = __errno_location();
      archive_set_error(a,*piVar3,"Error reading file");
    }
  }
  return sVar2;
}

Assistant:

static ssize_t
FILE_read(struct archive *a, void *client_data, const void **buff)
{
	struct read_FILE_data *mine = (struct read_FILE_data *)client_data;
	size_t bytes_read;

	*buff = mine->buffer;
	bytes_read = fread(mine->buffer, 1, mine->block_size, mine->f);
	if (bytes_read < mine->block_size && ferror(mine->f)) {
		archive_set_error(a, errno, "Error reading file");
	}
	return (bytes_read);
}